

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

macro_t new_macro(c2m_ctx_t c2m_ctx,token_t id,VARR_token_t *params,VARR_token_t *replacement)

{
  int iVar1;
  macro_t el;
  macro_t m;
  macro_t tab_m;
  pre_ctx_t pre_ctx;
  VARR_token_t *replacement_local;
  VARR_token_t *params_local;
  token_t id_local;
  c2m_ctx_t c2m_ctx_local;
  
  tab_m = (macro_t)c2m_ctx->pre_ctx;
  pre_ctx = (pre_ctx_t)replacement;
  replacement_local = params;
  params_local = (VARR_token_t *)id;
  id_local = (token_t)c2m_ctx;
  el = (macro_t)malloc(0x20);
  el->id = (token_t)params_local;
  el->params = replacement_local;
  el->replacement = (VARR_token_t *)pre_ctx;
  el->ignore_p = 0;
  iVar1 = HTAB_macro_t_do((HTAB_macro_t *)tab_m->replacement,el,HTAB_FIND,&m);
  if (iVar1 == 0) {
    HTAB_macro_t_do((HTAB_macro_t *)tab_m->replacement,el,HTAB_INSERT,&m);
    VARR_macro_tpush(*(VARR_macro_t **)&tab_m->ignore_p,el);
    return el;
  }
  __assert_fail("!HTAB_DO (macro_t, macro_tab, m, HTAB_FIND, tab_m)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x824,"macro_t new_macro(c2m_ctx_t, token_t, VARR_token_t *, VARR_token_t *)");
}

Assistant:

static macro_t new_macro (c2m_ctx_t c2m_ctx, token_t id, VARR (token_t) * params,
                          VARR (token_t) * replacement) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  macro_t tab_m, m = malloc (sizeof (struct macro));

  m->id = id;
  m->params = params;
  m->replacement = replacement;
  m->ignore_p = FALSE;
  assert (!HTAB_DO (macro_t, macro_tab, m, HTAB_FIND, tab_m));
  HTAB_DO (macro_t, macro_tab, m, HTAB_INSERT, tab_m);
  VARR_PUSH (macro_t, macros, m);
  return m;
}